

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O3

Error asmjit::X86RAPass_translateOperands(X86RAPass *self,Operand_ *opArray,uint32_t opCount)

{
  int *piVar1;
  ZoneHeap *pZVar2;
  X86RegMask *pXVar3;
  byte *pbVar4;
  uint8_t **ppuVar5;
  TiedReg *pTVar6;
  RACell *pRVar7;
  uint8_t *puVar8;
  uint32_t *puVar9;
  uint8_t uVar10;
  code cVar11;
  CodeBuilder *pCVar12;
  Zone *pZVar13;
  TiedReg *pTVar14;
  RACell *pRVar15;
  VirtReg *srcReg;
  char *pcVar16;
  _func_int *p_Var17;
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  byte bVar21;
  byte bVar22;
  ushort uVar23;
  ushort uVar24;
  uint *in_RAX;
  Zone *pZVar25;
  uint *puVar26;
  undefined1 uVar27;
  bool bVar28;
  code cVar29;
  uint32_t dstId;
  uint32_t extraout_EDX;
  long lVar30;
  X86RAPass *pXVar31;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  byte bVar36;
  uint uVar37;
  uint uVar38;
  VirtReg *pVVar39;
  uint uVar40;
  uint uVar41;
  undefined2 uVar42;
  uint uVar43;
  uint uVar44;
  long lVar45;
  uint32_t uVar46;
  X86RAPass *pXVar47;
  int iVar48;
  X86RAPass *unaff_R13;
  _func_int **pp_Var49;
  ulong uVar50;
  X86RAPass *pXVar51;
  char cVar52;
  X86RAPass *pXVar53;
  char *pcVar54;
  uint uVar55;
  bool bVar56;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_88;
  VirtReg *pVStack_78;
  X86RAPass *pXStack_70;
  Operand_ *pOStack_68;
  X86RAPass *pXStack_60;
  X86RAPass *pXStack_58;
  X86RAPass *pXStack_50;
  CodeBuilder *pCStack_48;
  code *pcStack_40;
  uint *local_38;
  X86RAPass *pXVar32;
  
  if (opCount != 0) {
    pCVar12 = (self->super_RAPass).super_CBPass._cb;
    puVar26 = (uint *)((long)&opArray->field_0 + 4);
    pXVar47 = (X86RAPass *)((ulong)opCount << 4);
    lVar45 = 0;
    pXVar53 = (X86RAPass *)0x0;
    pVVar39 = (VirtReg *)opArray;
    local_38 = in_RAX;
    do {
      uVar41 = *(uint *)((long)&(opArray + -2)[2].field_0 + lVar45);
      in_RAX = (uint *)(ulong)uVar41;
      if ((uVar41 & 7) == 2) {
        if ((uVar41 & 0xf8) < 9) {
LAB_0012dc45:
          in_RAX = (uint *)(ulong)(uVar41 & 0x1f00);
          if (0x100 < (uVar41 & 0x1f00)) {
            uVar41 = *(uint *)((undefined1 *)((long)&opArray->field_0 + 4) + lVar45);
            in_RAX = (uint *)(ulong)uVar41;
            uVar34._0_4_ = pCVar12[1].super_CodeEmitter._privateData;
            uVar34._4_4_ = pCVar12[1].super_CodeEmitter._globalHints;
            if (uVar41 - 0x100 < uVar34) {
              if (uVar41 == 0xffffffff) goto LAB_0012dcb8;
              in_RAX = (uint *)((long)puVar26 + lVar45);
              bVar36 = *(byte *)(*(long *)(*(long *)&pCVar12[1].super_CodeEmitter._type +
                                          (ulong)(uVar41 - 0x100) * 8) + 0x25);
              goto LAB_0012dc7b;
            }
          }
          goto LAB_0012dc80;
        }
        iVar48 = *(int *)((undefined1 *)((long)&opArray->field_0 + 0xc) + lVar45);
        uVar34 = (ulong)(iVar48 - 0x100);
        uVar33._0_4_ = pCVar12[1].super_CodeEmitter._privateData;
        uVar33._4_4_ = pCVar12[1].super_CodeEmitter._globalHints;
        if (uVar33 <= uVar34) goto LAB_0012dc45;
        if (iVar48 == -1) goto LAB_0012dcb3;
        pVVar39 = *(VirtReg **)(*(long *)&pCVar12[1].super_CodeEmitter._type + uVar34 * 8);
        if ((short)uVar41 < 0) {
          if (pVVar39->_memCell == (RACell *)0x0) {
            pcStack_40 = (code *)0x12dc3b;
            local_38 = puVar26;
            RAPass::_newVarCell(&self->super_RAPass,pVVar39);
            uVar41 = *(uint *)((long)&(opArray + -2)[2].field_0 + lVar45);
            puVar26 = local_38;
            unaff_R13 = self;
          }
          goto LAB_0012dc45;
        }
        if (pVVar39->_physId != 0xff) {
          *(uint *)((undefined1 *)((long)&opArray->field_0 + 0xc) + lVar45) = (uint)pVVar39->_physId
          ;
          goto LAB_0012dc45;
        }
LAB_0012dcbd:
        pcStack_40 = X86CallAlloc::run;
        X86RAPass_translateOperands();
        pZVar13 = *(Zone **)&pVVar39->_homeMask;
        (self->super_RAPass).super_CBPass._name = (char *)pVVar39;
        (self->super_RAPass)._zone = pZVar13;
        ((self->super_RAPass).super_CBPass._cb)->_cursor = *(CBNode **)pVVar39;
        pZVar25 = (Zone *)&pZVar13[1]._blockSize;
        (self->super_RAPass)._heap._zone = pZVar25;
        (self->super_RAPass)._heap._slots[1] =
             (Slot *)(&pZVar13[1]._blockSize + (ulong)*(byte *)((long)&pZVar13[1]._block + 2) * 6);
        (self->super_RAPass)._heap._slots[2] =
             (Slot *)(&pZVar13[1]._blockSize + (ulong)*(byte *)((long)&pZVar13[1]._block + 3) * 6);
        (self->super_RAPass)._heap._slots[0] =
             (Slot *)(&pZVar13[1]._blockSize + (ulong)*(byte *)((long)&pZVar13[1]._block + 1) * 6);
        uVar41 = *(uint *)&pZVar13->_block;
        *(uint *)((self->super_RAPass)._heap._slots + 3) = uVar41;
        uVar44 = *(uint *)((long)&pZVar13[1]._block + 4);
        *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c) = uVar44;
        *(undefined4 *)((self->super_RAPass)._heap._slots + 4) = 0;
        if ((ulong)uVar41 != 0) {
          lVar30 = 0;
          do {
            pZVar25 = (self->super_RAPass)._heap._zone;
            *(long *)(*(long *)((long)&pZVar25->_ptr + lVar30) + 0x30) =
                 (long)&pZVar25->_ptr + lVar30;
            lVar30 = lVar30 + 0x18;
          } while ((ulong)uVar41 * 0x18 != lVar30);
          pZVar25 = (self->super_RAPass)._heap._zone;
          uVar44 = (uint)*(byte *)((long)(self->super_RAPass)._heap._slots + 0x1c);
        }
        uVar42 = 0;
        (self->super_RAPass)._heap._slots[5] = (Slot *)0x0;
        uVar41._0_1_ = pVVar39[2]._state;
        uVar41._1_1_ = pVVar39[2]._physId;
        uVar41._2_1_ = pVVar39[2]._modified;
        uVar41._3_1_ = pVVar39[2].field_0x27;
        uVar35 = uVar41 & 0xffff;
        *(short *)((self->super_RAPass)._heap._slots + 5) = (short)uVar41;
        *(undefined1 *)((long)(self->super_RAPass)._heap._slots + 0x2a) =
             *(undefined1 *)((long)&pVVar39[2]._memCell + 4);
        *(undefined1 *)((long)(self->super_RAPass)._heap._slots + 0x2b) =
             *(undefined1 *)&pVVar39[2]._tied;
        *(undefined4 *)((long)(self->super_RAPass)._heap._slots + 0x2c) =
             *(undefined4 *)&pVVar39[2]._memCell;
        (self->super_RAPass)._heap._slots[6] = (Slot *)0x0;
        uVar44 = uVar44 & 0xff;
        pVStack_78 = pVVar39;
        pOStack_68 = opArray;
        pXStack_60 = pXVar47;
        pXStack_58 = unaff_R13;
        pXStack_50 = pXVar53;
        pCStack_48 = pCVar12;
        pcStack_40 = (code *)lVar45;
        if (uVar44 != 0) {
          pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          uVar41 = ~uVar35 & (uint)*(ushort *)&pZVar13[1]._end;
          uVar55 = ~(uint)*(ushort *)&pZVar13[1]._end;
          lVar45 = 0;
          do {
            uVar43 = *(uint *)((long)&pZVar25->_end + lVar45);
            bVar36 = *(byte *)(*(long *)((long)&pZVar25->_ptr + lVar45) + 0x25);
            if (bVar36 == 0xff) {
              uVar37 = 0;
              if ((uVar43 & 1) != 0) {
LAB_0012de38:
                uVar38 = *(uint *)((long)&pZVar25->_block + lVar45);
                if (uVar38 == 0) {
                  uVar38 = *(uint *)((long)&pZVar25->_block + lVar45 + 4);
                }
                if (((uVar38 & uVar37) == 0) &&
                   (((uVar37 & uVar55) == 0 || ((uVar43 & 0x1000) != 0)))) goto LAB_0012de14;
                *(byte *)((long)&pZVar25->_end + lVar45 + 5) = bVar36;
                *(uint *)((long)&pZVar25->_end + lVar45) = uVar43 | 0x400000;
                if (*(char *)((self->super_RAPass)._heap._slots + 4) != -1) goto LAB_0012de74;
                goto LAB_0012ff16;
              }
              *(uint *)((long)&pZVar25->_end + lVar45) = uVar43 | 0x400000;
              if (*(char *)((self->super_RAPass)._heap._slots + 4) != -1) {
LAB_0012de74:
                piVar1 = (int *)((self->super_RAPass)._heap._slots + 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_0012de78;
              }
              goto LAB_00130024;
            }
            if (0x1f < bVar36) goto LAB_0012fed0;
            uVar37 = 1 << (bVar36 & 0x1f);
            if ((uVar43 & 1) != 0) goto LAB_0012de38;
LAB_0012de14:
            uVar41 = uVar41 | uVar37;
LAB_0012de78:
            lVar45 = lVar45 + 0x18;
          } while ((ulong)(uVar44 * 8) * 3 != lVar45);
          uVar43 = 0;
          uVar42 = 0;
          if (uVar44 == 0) goto LAB_0012e064;
          uVar41 = ~uVar41 & (uint)*(ushort *)(pp_Var49 + 0x53);
          uVar33 = 0;
          while (((ulong)(&pZVar25->_end)[uVar33 * 3] & 0x400001) != 1) {
LAB_0012e049:
            uVar42 = (undefined2)uVar43;
            uVar33 = uVar33 + 1;
            if (uVar33 == uVar44) goto LAB_0012e064;
          }
          pXVar53 = (X86RAPass *)(&pZVar25->_ptr + uVar33 * 3);
          uVar37 = *(uint *)&(pXVar53->super_RAPass).super_CBPass._name;
          if (uVar37 != 0) {
            iVar48 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> iVar48 & 1) == 0; iVar48 = iVar48 + 1) {
              }
            }
            *(char *)((long)&(pXVar53->super_RAPass).super_CBPass._cb + 5) = (char)iVar48;
            uVar38 = uVar41;
LAB_0012e040:
            uVar43 = uVar43 | uVar37 & uVar41;
            uVar41 = uVar38;
            goto LAB_0012e049;
          }
          uVar37 = ~uVar35 & *(uint *)((long)&(pXVar53->super_RAPass).super_CBPass._name + 4);
          if (uVar37 == 0) goto LAB_00130065;
          if ((uVar37 & uVar37 - 1) != 0) {
            pXVar47 = (X86RAPass *)(self->super_RAPass).super_CBPass._name;
            iVar48 = 0;
            uVar38 = uVar37;
            do {
              pcVar54 = (pXVar47->super_RAPass).super_CBPass._name;
              uVar20 = uVar37;
              if ((((ulong)pcVar54 & 0xa00000) != 0) ||
                 ((((ulong)pcVar54 & 0x100000) != 0 &&
                  (pXVar47 = (X86RAPass *)(pXVar47->super_RAPass)._heap._slots[4],
                  pXVar47 == (X86RAPass *)0x0)))) break;
              pXVar47 = (X86RAPass *)(pXVar47->super_RAPass).super_CBPass._cb;
              if (pXVar47 == (X86RAPass *)0x0) goto LAB_0012fedf;
              pZVar13 = (pXVar47->super_RAPass)._heap._zone;
              uVar40 = uVar38;
              if (pZVar13 != (Zone *)0x0) {
                bVar36 = *(byte *)((long)&pZVar13[1]._block + 4);
                uVar20 = uVar38;
                if (bVar36 != 0) {
                  lVar45 = 0;
                  do {
                    if (*(uint8_t **)
                         ((long)&pZVar13[1]._blockSize +
                         lVar45 + (ulong)*(byte *)&pZVar13[1]._block * 0x18) ==
                        (&pZVar25->_ptr)[uVar33 * 3]) {
                      uVar37 = *(uint *)((long)&pZVar13[2]._end +
                                        lVar45 + (ulong)*(byte *)&pZVar13[1]._block * 0x18);
                      if (uVar37 != 0) {
                        uVar37 = uVar37 & uVar38;
                        if (uVar37 == 0) goto LAB_0012dfc5;
                        goto LAB_0012dfcf;
                      }
                      break;
                    }
                    lVar45 = lVar45 + 0x18;
                  } while ((ulong)bVar36 * 0x18 != lVar45);
                }
                uVar40 = ~(uint)(ushort)(*(ushort *)&pZVar13[1]._end |
                                        *(ushort *)&pZVar13[1]._ptr | (ushort)pZVar13->_blockSize) &
                         uVar38;
                uVar37 = uVar38;
                if (uVar40 == 0) break;
              }
              uVar38 = uVar40;
              iVar48 = iVar48 + 1;
              uVar20 = uVar37;
            } while (iVar48 != 0x40);
LAB_0012dfc5:
            uVar37 = uVar20;
            if (uVar37 != 0) goto LAB_0012dfcf;
            goto LAB_0012ff98;
          }
LAB_0012dfcf:
          uVar38 = ~uVar41 & uVar37;
          if (((~uVar41 & uVar37) == 0) &&
             (uVar38 = uVar41 & uVar37 & ~(uint)*(ushort *)(pp_Var49 + 0x54), uVar38 == 0)) {
            uVar38 = uVar37;
          }
          uVar37 = uVar38 & uVar55;
          if (uVar37 == 0) {
            uVar37 = uVar38;
          }
          if (((ulong)(&pZVar25->_end)[uVar33 * 3] & 0x1002) != 0) {
            uVar37 = uVar38;
          }
          uVar38 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          if (uVar37 == 0) {
            uVar38 = 0xffffffff;
          }
          if (uVar38 < 0x20) {
            uVar37 = 1 << ((byte)uVar38 & 0x1f);
            *(byte *)((long)&(pXVar53->super_RAPass).super_CBPass._cb + 5) = (byte)uVar38;
            *(uint *)&(pXVar53->super_RAPass).super_CBPass._name = uVar37;
            uVar35 = uVar35 | 1 << (uVar38 & 0x1f);
            uVar38 = uVar41 | 1 << (uVar38 & 0x1f);
            goto LAB_0012e040;
          }
          goto LAB_0013006a;
        }
LAB_0012e064:
        *(undefined2 *)((self->super_RAPass)._heap._slots + 6) = uVar42;
        *(short *)((self->super_RAPass)._heap._slots + 5) = (short)uVar35;
        bVar36 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x2a);
        bVar21 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1e);
        uVar41 = 0;
        if (bVar21 != 0) {
          pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          pTVar14 = (TiedReg *)(self->super_RAPass)._heap._slots[1];
          uVar35 = (uint)*(byte *)((long)&(self->super_RAPass)._zone[1]._end + 2);
          uVar44 = ~(uint)bVar36 & uVar35;
          lVar45 = 0;
          while( true ) {
            uVar55 = *(uint *)((long)&pTVar14->flags + lVar45);
            bVar22 = *(byte *)(*(long *)((long)&pTVar14->vreg + lVar45) + 0x25);
            if (bVar22 == 0xff) break;
            if (0x1f < bVar22) goto LAB_0012fed5;
            pXVar53 = (X86RAPass *)(ulong)(uint)(1 << (bVar22 & 0x1f));
            if ((uVar55 & 1) != 0) goto LAB_0012e0fc;
LAB_0012e0d8:
            uVar44 = uVar44 | (uint)pXVar53;
LAB_0012e142:
            lVar45 = lVar45 + 0x18;
            if ((ulong)((uint)bVar21 * 8) * 3 == lVar45) {
              uVar35 = 0;
              uVar27 = 0;
              if (bVar21 == 0) goto LAB_0012e1ac;
              bVar22 = *(byte *)((long)pp_Var49 + 0x29a);
              lVar45 = 0;
              while ((*(uint *)((long)&pTVar14->flags + lVar45) & 0x400001) != 1) {
LAB_0012e19f:
                uVar27 = (undefined1)uVar35;
                lVar45 = lVar45 + 0x18;
                if ((ulong)bVar21 * 0x18 == lVar45) goto LAB_0012e1ac;
              }
              uVar55 = *(uint *)((long)&pTVar14->inRegs + lVar45);
              if (uVar55 != 0) {
                iVar48 = 0;
                if (uVar55 != 0) {
                  for (; (uVar55 >> iVar48 & 1) == 0; iVar48 = iVar48 + 1) {
                  }
                }
                *(char *)((long)&pTVar14->field_2 + lVar45 + 1) = (char)iVar48;
                uVar35 = uVar35 | uVar55 & ~uVar44 & (uint)bVar22;
                goto LAB_0012e19f;
              }
              goto LAB_0012ff8e;
            }
          }
          pXVar53 = (X86RAPass *)0x0;
          if ((uVar55 & 1) != 0) {
LAB_0012e0fc:
            uVar43 = *(uint *)((long)&pTVar14->inRegs + lVar45);
            if (uVar43 == 0) {
              uVar43 = *(uint *)((long)&pTVar14->allocableRegs + lVar45);
            }
            if (((uVar43 & (uint)pXVar53) == 0) &&
               ((((uint)pXVar53 & ~uVar35) == 0 || ((uVar55 & 0x1000) != 0)))) goto LAB_0012e0d8;
            *(byte *)((long)&pTVar14->field_2 + lVar45 + 1) = bVar22;
            *(uint *)((long)&pTVar14->flags + lVar45) = uVar55 | 0x400000;
            if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x22) != -1) goto LAB_0012e13a;
            goto LAB_0012ff34;
          }
          *(uint *)((long)&pTVar14->flags + lVar45) = uVar55 | 0x400000;
          if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x22) != -1) {
LAB_0012e13a:
            piVar1 = (int *)((self->super_RAPass)._heap._slots + 4);
            *piVar1 = *piVar1 + 0x10000;
            goto LAB_0012e142;
          }
          goto LAB_00130029;
        }
        uVar27 = 0;
LAB_0012e1ac:
        *(undefined1 *)((long)(self->super_RAPass)._heap._slots + 0x32) = uVar27;
        *(byte *)((long)(self->super_RAPass)._heap._slots + 0x2a) = bVar36;
        uVar44 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x2c);
        bVar36 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x1d);
        if (bVar36 != 0) {
          pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          pRVar15 = (RACell *)(self->super_RAPass)._heap._slots[0];
          uVar41 = *(uint *)((long)&(self->super_RAPass)._zone[1]._end + 4);
          uVar35 = ~uVar44 & uVar41;
          lVar45 = 0;
          while( true ) {
            uVar55 = *(uint *)((long)&pRVar15->offset + lVar45);
            bVar21 = *(byte *)(*(long *)((long)&pRVar15->next + lVar45) + 0x25);
            if (bVar21 == 0xff) break;
            if (0x1f < bVar21) goto LAB_0012feda;
            uVar43 = 1 << (bVar21 & 0x1f);
            if ((uVar55 & 1) != 0) goto LAB_0012e23b;
LAB_0012e219:
            uVar35 = uVar35 | uVar43;
LAB_0012e283:
            lVar45 = lVar45 + 0x18;
            if ((ulong)((uint)bVar36 * 8) * 3 == lVar45) {
              if (bVar36 == 0) {
                uVar41 = 0;
                goto LAB_0012e2e8;
              }
              uVar55 = *(uint *)((long)pp_Var49 + 0x29c);
              lVar45 = 0;
              uVar41 = 0;
              while ((*(uint *)((long)&pRVar15->offset + lVar45) & 0x400001) != 1) {
LAB_0012e2db:
                lVar45 = lVar45 + 0x18;
                if ((ulong)bVar36 * 0x18 == lVar45) goto LAB_0012e2e8;
              }
              uVar43 = *(uint *)((long)&pRVar15->alignment + lVar45);
              if (uVar43 != 0) {
                iVar48 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> iVar48 & 1) == 0; iVar48 = iVar48 + 1) {
                  }
                }
                *(char *)((long)&pRVar15->size + lVar45 + 1) = (char)iVar48;
                uVar41 = uVar41 | uVar43 & ~uVar35 & uVar55;
                goto LAB_0012e2db;
              }
              goto LAB_0012ff93;
            }
          }
          uVar43 = 0;
          if ((uVar55 & 1) != 0) {
LAB_0012e23b:
            uVar37 = *(uint *)((long)&pRVar15->alignment + lVar45);
            if (uVar37 == 0) {
              uVar37 = *(uint *)(&pRVar15->field_0x14 + lVar45);
            }
            pXVar53 = (X86RAPass *)(ulong)uVar37;
            if (((uVar37 & uVar43) == 0) &&
               (((uVar43 & ~uVar41) == 0 ||
                (pXVar53 = (X86RAPass *)(ulong)(uVar55 & 0x1000), (uVar55 & 0x1000) != 0))))
            goto LAB_0012e219;
            *(byte *)((long)&pRVar15->size + lVar45 + 1) = bVar21;
            *(uint *)((long)&pRVar15->offset + lVar45) = uVar55 | 0x400000;
            if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x21) != -1) goto LAB_0012e27b;
            goto LAB_0012ff39;
          }
          *(uint *)((long)&pRVar15->offset + lVar45) = uVar55 | 0x400000;
          if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x21) != -1) {
LAB_0012e27b:
            piVar1 = (int *)((self->super_RAPass)._heap._slots + 4);
            *piVar1 = *piVar1 + 0x100;
            goto LAB_0012e283;
          }
          goto LAB_0013002e;
        }
LAB_0012e2e8:
        *(uint *)((long)(self->super_RAPass)._heap._slots + 0x34) = uVar41;
        *(uint *)((long)(self->super_RAPass)._heap._slots + 0x2c) = uVar44;
        uVar23 = *(ushort *)((self->super_RAPass)._heap._slots + 6);
        if (uVar23 != 0) {
          pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          pXVar53 = (X86RAPass *)0xffffffff;
          uVar41 = (uint)uVar23;
          while( true ) {
            iVar48 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> iVar48 & 1) == 0; iVar48 = iVar48 + 1) {
              }
            }
            bVar36 = (char)iVar48 + 1U & 0x1f;
            pXVar53 = (X86RAPass *)(ulong)((int)pXVar53 + iVar48 + 1);
            pXVar47 = (X86RAPass *)pp_Var49[(long)((long)(pXVar53->super_RAPass)._heap._slots + 3)];
            if ((pXVar47 == (X86RAPass *)0x0) ||
               ((TiedReg *)(pXVar47->super_RAPass)._heap._slots[1] != (TiedReg *)0x0))
            goto LAB_0012feb2;
            uVar44 = ((RegInfo *)((long)&(pXVar47->super_RAPass).super_CBPass._vptr_CBPass + 4))->
                     _signature;
            if ((uVar44 & 0xf00) != 0) goto LAB_0012fec1;
            pXVar32 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            if (*(uint8_t *)((long)&(pXVar47->super_RAPass)._heap._zone + 4) == '\x01') break;
LAB_0012e3f7:
            X86RAPass::_checkState(pXVar32);
            uVar44 = uVar41 >> bVar36;
            uVar41 = uVar41 >> bVar36;
            if (uVar44 == 0) goto LAB_0012e407;
          }
          bVar21 = *(uint8_t *)((long)&(pXVar47->super_RAPass)._heap._zone + 5);
          if (bVar21 == 0xff) goto LAB_0012fee4;
          if ((X86RAPass *)(pXVar32->_x86State).field_0._list[bVar21] != pXVar47) goto LAB_0012fee9;
          if (*(uint8_t *)((long)&(pXVar47->super_RAPass)._heap._zone + 6) != '\0') {
            X86RAPass::emitSave(pXVar32,(VirtReg *)pXVar47,(uint)bVar21,"Spill");
            uVar44 = ((RegInfo *)((long)&(pXVar47->super_RAPass).super_CBPass._vptr_CBPass + 4))->
                     _signature;
          }
          if ((uVar44 & 0xf00) != 0) goto LAB_0012feee;
          if (*(uint8_t *)((long)&(pXVar47->super_RAPass)._heap._zone + 5) != bVar21)
          goto LAB_0012fef3;
          if (bVar21 < 0x20) {
            *(undefined2 *)((long)&(pXVar47->super_RAPass)._heap._zone + 4) = 0xff02;
            *(uint8_t *)((long)&(pXVar47->super_RAPass)._heap._zone + 6) = '\0';
            uVar23 = (ushort)(-2 << (bVar21 & 0x1f)) |
                     (ushort)(0xfffffffe >> 0x20 - (bVar21 & 0x1f));
            (pXVar32->_x86State).field_0._list[bVar21] = (VirtReg *)0x0;
            pXVar3 = &(pXVar32->_x86State)._occupied;
            (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp & uVar23;
            pXVar3 = &(pXVar32->_x86State)._modified;
            (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp & uVar23;
            X86RAPass::_checkState(pXVar32);
            goto LAB_0012e3f7;
          }
          goto LAB_0012fef8;
        }
LAB_0012e407:
        bVar36 = *(byte *)((long)(self->super_RAPass)._heap._slots + 0x32);
        if (bVar36 != 0) {
          pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          pXVar53 = (X86RAPass *)0xffffffff;
          uVar41 = (uint)bVar36;
          while( true ) {
            iVar48 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> iVar48 & 1) == 0; iVar48 = iVar48 + 1) {
              }
            }
            bVar36 = (char)iVar48 + 1U & 0x1f;
            pXVar53 = (X86RAPass *)(ulong)((int)pXVar53 + iVar48 + 1);
            pVVar39 = (VirtReg *)pp_Var49[(long)(pXVar53->super_RAPass)._heap._slots + 0x13];
            if ((pVVar39 == (VirtReg *)0x0) || (pVVar39->_tied != (TiedReg *)0x0))
            goto LAB_0012feb7;
            uVar44 = (pVVar39->_regInfo)._signature;
            if ((uVar44 & 0xf00) != 0x200) goto LAB_0012fec6;
            pXVar47 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            if (pVVar39->_state == '\x01') break;
LAB_0012e515:
            X86RAPass::_checkState(pXVar47);
            uVar44 = uVar41 >> bVar36;
            uVar41 = uVar41 >> bVar36;
            if (uVar44 == 0) goto LAB_0012e525;
          }
          bVar21 = pVVar39->_physId;
          if (bVar21 == 0xff) goto LAB_0012fefd;
          if (*(VirtReg **)((long)&(pXVar47->_x86State).field_0 + (ulong)bVar21 * 8 + 0x80) !=
              pVVar39) goto LAB_0012ff02;
          if (pVVar39->_modified != '\0') {
            X86RAPass::emitSave(pXVar47,pVVar39,(uint)bVar21,"Spill");
            uVar44 = (pVVar39->_regInfo)._signature;
          }
          if ((uVar44 & 0xf00) != 0x200) goto LAB_0012ff07;
          if (pVVar39->_physId != bVar21) goto LAB_0012ff0c;
          if (bVar21 < 0x20) {
            pVVar39->_state = '\x02';
            pVVar39->_physId = 0xff;
            pVVar39->_modified = '\0';
            *(undefined8 *)((long)&(pXVar47->_x86State).field_0 + (ulong)bVar21 * 8 + 0x80) = 0;
            bVar21 = ~(byte)(1 << (bVar21 & 0x1f));
            puVar8 = &(pXVar47->_x86State)._occupied.field_0.field_0._mm;
            *puVar8 = *puVar8 & bVar21;
            puVar8 = &(pXVar47->_x86State)._modified.field_0.field_0._mm;
            *puVar8 = *puVar8 & bVar21;
            X86RAPass::_checkState(pXVar47);
            goto LAB_0012e515;
          }
          goto LAB_0012ff11;
        }
LAB_0012e525:
        uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x34);
        if (uVar41 != 0) {
          pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
          pXVar53 = (X86RAPass *)0xffffffff;
          while( true ) {
            iVar48 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> iVar48 & 1) == 0; iVar48 = iVar48 + 1) {
              }
            }
            uVar41 = uVar41 >> ((char)iVar48 + 1U & 0x1f);
            pXVar53 = (X86RAPass *)(ulong)((int)pXVar53 + iVar48 + 1);
            pVVar39 = (VirtReg *)pp_Var49[(long)(pXVar53->super_RAPass)._heap._slots + 0x1b];
            if ((pVVar39 == (VirtReg *)0x0) || (pVVar39->_tied != (TiedReg *)0x0))
            goto LAB_0012febc;
            uVar44 = (pVVar39->_regInfo)._signature;
            if ((uVar44 & 0xf00) != 0x100) goto LAB_0012fecb;
            pXVar47 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            if (pVVar39->_state == '\x01') break;
LAB_0012e630:
            X86RAPass::_checkState(pXVar47);
            if (uVar41 == 0) goto LAB_0012e640;
          }
          bVar36 = pVVar39->_physId;
          if (bVar36 == 0xff) goto LAB_0012ff1b;
          if (*(VirtReg **)((long)&(pXVar47->_x86State).field_0 + (ulong)bVar36 * 8 + 0xc0) !=
              pVVar39) goto LAB_0012ff20;
          if (pVVar39->_modified != '\0') {
            X86RAPass::emitSave(pXVar47,pVVar39,(uint)bVar36,"Spill");
            uVar44 = (pVVar39->_regInfo)._signature;
          }
          if ((uVar44 & 0xf00) != 0x100) goto LAB_0012ff25;
          if (pVVar39->_physId != bVar36) goto LAB_0012ff2a;
          if (bVar36 < 0x20) {
            pVVar39->_state = '\x02';
            pVVar39->_physId = 0xff;
            pVVar39->_modified = '\0';
            uVar44 = -2 << (bVar36 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar36 & 0x1f);
            *(undefined8 *)((long)&(pXVar47->_x86State).field_0 + (ulong)bVar36 * 8 + 0xc0) = 0;
            puVar9 = &(pXVar47->_x86State)._occupied.field_0.field_0._vec;
            *puVar9 = *puVar9 & uVar44;
            puVar9 = &(pXVar47->_x86State)._modified.field_0.field_0._vec;
            *puVar9 = *puVar9 & uVar44;
            X86RAPass::_checkState(pXVar47);
            goto LAB_0012e630;
          }
          goto LAB_0012ff2f;
        }
LAB_0012e640:
        uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
        uVar44 = *(uint *)((self->super_RAPass)._heap._slots + 4);
        if (((uVar44 & 0xff) != (uVar41 & 0xff)) && ((uVar41 & 0xff) != 0)) {
          pZVar25 = (self->super_RAPass)._heap._zone;
          pXVar32 = (X86RAPass *)0x0;
          bVar36 = 0;
          while (bVar21 = bVar36, ((ulong)(&pZVar25->_end)[(long)pXVar32 * 3] & 0x400001) != 1) {
LAB_0012ea03:
            pXVar53 = (X86RAPass *)0x0;
            uVar35 = (int)pXVar32 + 1;
            bVar28 = uVar35 < (uVar41 & 0xff);
            pXVar32 = (X86RAPass *)(ulong)uVar35;
            if (!bVar28) {
              pXVar32 = pXVar53;
            }
            bVar36 = bVar28 & bVar21;
            if (!(bool)(bVar28 | bVar21)) {
              uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
              goto LAB_0012ea29;
            }
          }
          ppuVar5 = &pZVar25->_ptr + (long)pXVar32 * 3;
          pVVar39 = (VirtReg *)*ppuVar5;
          bVar36 = pVVar39->_physId;
          pXVar47 = (X86RAPass *)CONCAT71((int7)((ulong)pXVar47 >> 8),bVar36);
          bVar21 = *(byte *)((long)ppuVar5 + 0xd);
          pcVar54 = (char *)(ulong)bVar21;
          if (bVar36 == bVar21) goto LAB_0013001a;
          pXVar31 = (X86RAPass *)(ulong)bVar21;
          pXVar51 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          srcReg = (pXVar51->_x86State).field_0._list[(long)pXVar31];
          if (srcReg == (VirtReg *)0x0) {
            uVar44 = (pVVar39->_regInfo)._signature;
            if (bVar36 == 0xff) {
              if ((uVar44 & 0xf00) == 0) {
                if (bVar21 == 0xff) goto LAB_00130149;
                pXVar53 = (X86RAPass *)pcVar54;
                if (0x1f < bVar21) goto LAB_0013014e;
                uVar44 = 1 << (bVar21 & 0x1f);
                if (pVVar39->_state == '\x02') {
                  X86RAPass::emitLoad(pXVar51,pVVar39,(uint)bVar21,"Alloc");
                  pXVar47 = pXVar31;
                }
                else if (pVVar39->_state == '\x01') {
                  X86RAPass::emitMove(pXVar51,pVVar39,(uint)bVar21,(uint)bVar36,"Alloc");
                  pXVar51[2]._x86State.field_0._list[1] = (VirtReg *)0x0;
                  goto LAB_001301e9;
                }
                pVVar39->_modified = '\0';
                pVVar39->_state = '\x01';
                pVVar39->_physId = bVar21;
                pVVar39->_homeMask = pVVar39->_homeMask | uVar44;
                (pXVar51->_x86State).field_0._list[(long)pXVar31] = pVVar39;
                pXVar3 = &(pXVar51->_x86State)._occupied;
                uVar24 = (ushort)uVar44;
                (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp ^ uVar24;
                pXVar53 = (X86RAPass *)0x0;
                uVar23 = uVar24;
                if (pVVar39->_modified == '\0') {
                  uVar23 = 0;
                }
                pXVar3 = &(pXVar51->_x86State)._modified;
                (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp ^ uVar23;
                X86RAPass::_checkState(pXVar51);
                pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass + 0x56;
                *(ushort *)pp_Var49 = *(ushort *)pp_Var49 | uVar24;
                *(byte *)((long)ppuVar5 + 10) = *(byte *)((long)ppuVar5 + 10) | 0x40;
                pXVar51 = self;
                if (*(char *)((self->super_RAPass)._heap._slots + 4) != -1) {
LAB_0012e9f7:
                  uVar44 = *(int *)((self->super_RAPass)._heap._slots + 4) + 1;
                  *(uint *)((self->super_RAPass)._heap._slots + 4) = uVar44;
                  bVar21 = 1;
                  goto LAB_0012ea03;
                }
              }
              else {
LAB_00130144:
                X86CallAlloc::run();
LAB_00130149:
                X86CallAlloc::run();
                pXVar53 = (X86RAPass *)pcVar54;
LAB_0013014e:
                X86CallAlloc::run();
                pXVar51 = self;
              }
              X86CallAlloc::run();
LAB_00130158:
              X86CallAlloc::run();
LAB_0013015d:
              X86CallAlloc::run();
LAB_00130162:
              X86CallAlloc::run();
LAB_00130167:
              X86CallAlloc::run();
LAB_0013016c:
              X86CallAlloc::run();
LAB_00130171:
              X86CallAlloc::run();
LAB_00130176:
              X86CallAlloc::run();
LAB_0013017b:
              self = pXVar51;
              X86CallAlloc::run();
LAB_00130180:
              uVar46 = (uint32_t)pXVar47;
              X86CallAlloc::run();
              pXVar51 = self;
              dstId = extraout_EDX;
LAB_00130185:
              X86RAPass::emitMove(pXVar51,(VirtReg *)pXVar53,dstId,uVar46,"Alloc");
              pXVar51[2]._x86State.field_0._list[0x11] = (VirtReg *)0x0;
LAB_001301e9:
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../base/../base/../base/../base/utils.h"
                         ,0x13e,"x < 32");
            }
            if ((uVar44 & 0xf00) != 0) goto LAB_001300ab;
            if (pVVar39->_state != '\x01') goto LAB_001300b0;
            pXStack_70 = pXVar31;
            X86RAPass::emitMove(pXVar51,pVVar39,(uint)bVar21,(uint)bVar36,"Move");
            if (((pVVar39->_regInfo)._signature & 0xf00) != 0) goto LAB_001300b5;
            if (0x1f < bVar21) goto LAB_001300ba;
            if (0x1f < bVar36) goto LAB_001300bf;
            uVar23 = (ushort)(1 << (bVar21 & 0x1f));
            uVar24 = uVar23 ^ (ushort)(1 << ((uint)pXVar47 & 0x1f));
            pVVar39->_physId = bVar21;
            (pXVar51->_x86State).field_0._list[bVar36] = (VirtReg *)0x0;
            (pXVar51->_x86State).field_0._list[(long)pXStack_70] = pVVar39;
            pXVar3 = &(pXVar51->_x86State)._occupied;
            (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp ^ uVar24;
            if (pVVar39->_modified == '\0') {
              uVar24 = 0;
            }
            pXVar3 = &(pXVar51->_x86State)._modified;
            (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp ^ uVar24;
            X86RAPass::_checkState(pXVar51);
            X86RAPass::_checkState(pXVar51);
            pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass + 0x56;
            *(ushort *)pp_Var49 = *(ushort *)pp_Var49 | uVar23;
            *(byte *)((long)ppuVar5 + 10) = *(byte *)((long)ppuVar5 + 10) | 0x40;
            pXVar47 = pXVar51;
            if (*(char *)((self->super_RAPass)._heap._slots + 4) != -1) goto LAB_0012e9f7;
            goto LAB_001300c4;
          }
          if (pVVar39 == srcReg) goto LAB_0013003d;
          if (((pVVar39->_regInfo)._signature & 0xf00) != 0) goto LAB_00130042;
          if (pVVar39->_state != '\x01') goto LAB_00130047;
          if (bVar36 == 0xff) goto LAB_0013004c;
          if (((srcReg->_regInfo)._signature & 0xf00) != 0) goto LAB_00130051;
          if (srcReg->_state != '\x01') goto LAB_00130056;
          bVar21 = srcReg->_physId;
          if (bVar21 == 0xff) goto LAB_0013005b;
          pTVar14 = srcReg->_tied;
          X86RAPass::emitSwapGp(pXVar51,pVVar39,srcReg,(uint)bVar36,(uint)bVar21,"Swap");
          pVVar39->_physId = bVar21;
          srcReg->_physId = bVar36;
          (pXVar51->_x86State).field_0._list[bVar36] = srcReg;
          (pXVar51->_x86State).field_0._list[bVar21] = pVVar39;
          bVar28 = (srcReg->_modified != '\0') != (pVVar39->_modified != '\0');
          pXVar3 = &(pXVar51->_x86State)._modified;
          (pXVar3->field_0).field_0._gp =
               (pXVar3->field_0).field_0._gp ^
               ((ushort)bVar28 << (bVar21 & 0x1f) | (ushort)bVar28 << (bVar36 & 0x1f));
          X86RAPass::_checkState(pXVar51);
          *(byte *)((long)ppuVar5 + 10) = *(byte *)((long)ppuVar5 + 10) | 0x40;
          if (*(char *)((self->super_RAPass)._heap._slots + 4) == -1) goto LAB_00130060;
          uVar44 = *(int *)((self->super_RAPass)._heap._slots + 4) + 1;
          *(uint *)((self->super_RAPass)._heap._slots + 4) = uVar44;
          bVar21 = 1;
          if ((pTVar14 == (TiedReg *)0x0) || (bVar36 != (pTVar14->field_2).field_0.inPhysId))
          goto LAB_0012ea03;
          pbVar4 = (byte *)((long)&pTVar14->flags + 2);
          *pbVar4 = *pbVar4 | 0x40;
          if (*(char *)((self->super_RAPass)._heap._slots + 4) != -1) goto LAB_0012e9f7;
          goto LAB_001300c9;
        }
LAB_0012ea29:
        uVar35 = uVar41 >> 0x10 & 0xff;
        pcVar54 = (char *)pXVar53;
        if (((uVar44 >> 0x10 & 0xff) != uVar35) && (uVar35 != 0)) {
          pTVar14 = (TiedReg *)(self->super_RAPass)._heap._slots[1];
          uVar33 = 0;
          bVar28 = false;
          while ((pTVar14[uVar33].flags & 0x400001) != 1) {
LAB_0012ec79:
            uVar35 = (int)uVar33 + 1;
            bVar56 = uVar35 < (uVar41 >> 0x10 & 0xff);
            uVar33 = (ulong)uVar35;
            if (!bVar56) {
              uVar33 = 0;
            }
            bVar19 = !bVar28;
            bVar28 = (bool)(bVar28 & bVar56);
            if (!bVar56 && bVar19) {
              uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
              pcVar54 = (char *)pXVar53;
              goto LAB_0012ec9e;
            }
          }
          pTVar6 = pTVar14 + uVar33;
          pXVar53 = (X86RAPass *)pTVar6->vreg;
          bVar36 = *(uint8_t *)((long)&(pXVar53->super_RAPass)._heap._zone + 5);
          pXVar47 = (X86RAPass *)(ulong)bVar36;
          uVar46 = (uint32_t)bVar36;
          bVar21 = (pTVar6->field_2).field_0.inPhysId;
          if (bVar36 == bVar21) goto LAB_00130006;
          pXVar32 = (X86RAPass *)(ulong)bVar21;
          dstId = (uint32_t)bVar21;
          pXVar51 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          if (*(long *)((long)&(pXVar51->_x86State).field_0 + (long)pXVar32 * 8 + 0x80) != 0)
          goto LAB_0012ec79;
          uVar44 = ((RegInfo *)((long)&(pXVar53->super_RAPass).super_CBPass._vptr_CBPass + 4))->
                   _signature & 0xf00;
          uVar35 = (uint)bVar36;
          if (uVar35 == 0xff) {
            if (uVar44 != 0x200) {
LAB_0013011c:
              X86CallAlloc::run();
LAB_00130121:
              X86CallAlloc::run();
LAB_00130126:
              X86CallAlloc::run();
LAB_0013012b:
              X86CallAlloc::run();
LAB_00130130:
              X86CallAlloc::run();
LAB_00130135:
              X86CallAlloc::run();
              pcVar54 = (char *)pXVar53;
LAB_0013013a:
              X86CallAlloc::run();
              goto LAB_0013013f;
            }
            if (bVar21 == 0xff) goto LAB_00130121;
            if (0x1f < bVar21) goto LAB_00130126;
            uVar10 = *(uint8_t *)((long)&(pXVar53->super_RAPass)._heap._zone + 4);
            uVar44 = 1 << (bVar21 & 0x1f);
            if (uVar10 == '\x02') {
              X86RAPass::emitLoad(pXVar51,(VirtReg *)pXVar53,(uint)bVar21,"Alloc");
              pXVar47 = pXVar32;
LAB_0012ebfd:
              *(uint8_t *)((long)&(pXVar53->super_RAPass)._heap._zone + 6) = '\0';
              *(uint8_t *)((long)&(pXVar53->super_RAPass)._heap._zone + 4) = '\x01';
              *(byte *)((long)&(pXVar53->super_RAPass)._heap._zone + 5) = bVar21;
              pZVar2 = &(pXVar53->super_RAPass)._heap;
              *(uint *)&pZVar2->_zone = *(uint *)&pZVar2->_zone | uVar44;
              *(X86RAPass **)((long)&(pXVar51->_x86State).field_0 + (long)pXVar32 * 8 + 0x80) =
                   pXVar53;
              puVar8 = &(pXVar51->_x86State)._occupied.field_0.field_0._mm;
              bVar21 = (byte)uVar44;
              *puVar8 = *puVar8 ^ bVar21;
              bVar36 = bVar21;
              if (*(uint8_t *)((long)&(pXVar53->super_RAPass)._heap._zone + 6) == '\0') {
                bVar36 = 0;
              }
              puVar8 = &(pXVar51->_x86State)._modified.field_0.field_0._mm;
              *puVar8 = *puVar8 ^ bVar36;
              pXVar53 = (X86RAPass *)(ulong)uVar44;
              X86RAPass::_checkState(pXVar51);
              pbVar4 = (byte *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b2);
              *pbVar4 = *pbVar4 | bVar21;
              pbVar4 = (byte *)((long)&pTVar6->flags + 2);
              *pbVar4 = *pbVar4 | 0x40;
              if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x22) != -1) {
LAB_0012ec58:
                uVar44 = *(int *)((self->super_RAPass)._heap._slots + 4) + 0x10000;
                *(uint *)((self->super_RAPass)._heap._slots + 4) = uVar44;
                bVar28 = true;
                goto LAB_0012ec79;
              }
              goto LAB_0013012b;
            }
            if (uVar10 != '\x01') goto LAB_0012ebfd;
            goto LAB_00130185;
          }
          if (uVar44 != 0x200) goto LAB_0013006f;
          if (*(uint8_t *)((long)&(pXVar53->super_RAPass)._heap._zone + 4) != '\x01')
          goto LAB_00130074;
          X86RAPass::emitMove(pXVar51,(VirtReg *)pXVar53,(uint)bVar21,uVar35,"Move");
          if ((((RegInfo *)((long)&(pXVar53->super_RAPass).super_CBPass._vptr_CBPass + 4))->
               _signature & 0xf00) != 0x200) goto LAB_00130079;
          if (0x1f < bVar21) goto LAB_0013007e;
          if (0x1f < bVar36) goto LAB_00130083;
          bVar36 = (byte)(1 << (bVar21 & 0x1f));
          bVar22 = bVar36 ^ (byte)(1 << (uVar35 & 0x1f));
          *(byte *)((long)&(pXVar53->super_RAPass)._heap._zone + 5) = bVar21;
          *(undefined8 *)((long)&(pXVar51->_x86State).field_0 + (ulong)uVar35 * 8 + 0x80) = 0;
          *(X86RAPass **)((long)&(pXVar51->_x86State).field_0 + (long)pXVar32 * 8 + 0x80) = pXVar53;
          puVar8 = &(pXVar51->_x86State)._occupied.field_0.field_0._mm;
          *puVar8 = *puVar8 ^ bVar22;
          if (*(uint8_t *)((long)&(pXVar53->super_RAPass)._heap._zone + 6) == '\0') {
            bVar22 = 0;
          }
          puVar8 = &(pXVar51->_x86State)._modified.field_0.field_0._mm;
          *puVar8 = *puVar8 ^ bVar22;
          X86RAPass::_checkState(pXVar51);
          X86RAPass::_checkState(pXVar51);
          pbVar4 = (byte *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b2);
          *pbVar4 = *pbVar4 | bVar36;
          pbVar4 = (byte *)((long)&pTVar6->flags + 2);
          *pbVar4 = *pbVar4 | 0x40;
          if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x22) != -1) goto LAB_0012ec58;
          goto LAB_00130088;
        }
LAB_0012ec9e:
        uVar35 = uVar41 >> 8 & 0xff;
        if (((uVar44 >> 8 & 0xff) != uVar35) && (uVar35 != 0)) {
          pRVar15 = (RACell *)(self->super_RAPass)._heap._slots[0];
          uVar33 = 0;
          bVar36 = 0;
          while ((pRVar15[uVar33].offset & 0x400001U) != 1) {
LAB_0012eef1:
            uVar44 = (int)uVar33 + 1;
            bVar28 = uVar44 < (uVar41 >> 8 & 0xff);
            uVar33 = (ulong)uVar44;
            if (!bVar28) {
              uVar33 = 0;
            }
            bVar56 = (bool)(bVar28 | bVar36);
            bVar36 = bVar36 & bVar28;
            if (!bVar56) goto LAB_0012ef0b;
          }
          pRVar7 = pRVar15 + uVar33;
          pXVar51 = (X86RAPass *)pRVar7->next;
          bVar21 = *(byte *)((long)&(pXVar51->super_RAPass)._heap._zone + 5);
          pXVar47 = (X86RAPass *)(ulong)bVar21;
          bVar22 = *(byte *)((long)&pRVar7->size + 1);
          if (bVar21 == bVar22) goto LAB_0013000b;
          pXVar32 = (X86RAPass *)(ulong)bVar22;
          pXVar53 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          pcVar54 = (char *)pXVar53;
          if (*(long *)((long)&(pXVar53->_x86State).field_0 + (long)pXVar32 * 8 + 0xc0) != 0)
          goto LAB_0012eef1;
          uVar44 = *(uint *)((long)&(pXVar51->super_RAPass).super_CBPass._vptr_CBPass + 4) & 0xf00;
          uVar35 = (uint)bVar21;
          if (uVar35 == 0xff) {
            if (uVar44 != 0x100) goto LAB_00130130;
            if (bVar22 == 0xff) goto LAB_00130135;
            if (0x1f < bVar22) goto LAB_0013013a;
            cVar52 = *(char *)((long)&(pXVar51->super_RAPass)._heap._zone + 4);
            uVar44 = 1 << (bVar22 & 0x1f);
            if (cVar52 == '\x02') {
              X86RAPass::emitLoad(pXVar53,(VirtReg *)pXVar51,(uint)bVar22,"Alloc");
              pXVar47 = pXVar32;
            }
            else if (cVar52 == '\x01') {
              X86RAPass::emitMove(pXVar53,(VirtReg *)pXVar51,(uint)bVar22,0xff,"Alloc");
              pXVar53[2]._x86State.field_0._list[0x19] = (VirtReg *)0x0;
              goto LAB_001301e9;
            }
            *(undefined1 *)((long)&(pXVar51->super_RAPass)._heap._zone + 6) = 0;
            *(undefined1 *)((long)&(pXVar51->super_RAPass)._heap._zone + 4) = 1;
            *(byte *)((long)&(pXVar51->super_RAPass)._heap._zone + 5) = bVar22;
            pZVar2 = &(pXVar51->super_RAPass)._heap;
            *(uint *)&pZVar2->_zone = *(uint *)&pZVar2->_zone | uVar44;
            *(X86RAPass **)((long)&(pXVar53->_x86State).field_0 + (long)pXVar32 * 8 + 0xc0) =
                 pXVar51;
            puVar9 = &(pXVar53->_x86State)._occupied.field_0.field_0._vec;
            *puVar9 = *puVar9 ^ uVar44;
            uVar35 = uVar44;
            if (*(char *)((long)&(pXVar51->super_RAPass)._heap._zone + 6) == '\0') {
              uVar35 = 0;
            }
            puVar9 = &(pXVar53->_x86State)._modified.field_0.field_0._vec;
            *puVar9 = *puVar9 ^ uVar35;
            pcVar54 = (char *)(ulong)uVar44;
            X86RAPass::_checkState(pXVar53);
            puVar26 = (uint *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b4);
            *puVar26 = *puVar26 | uVar44;
            pbVar4 = (byte *)((long)&pRVar7->offset + 2);
            *pbVar4 = *pbVar4 | 0x40;
            if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x21) != -1) {
LAB_0012eed6:
              piVar1 = (int *)((self->super_RAPass)._heap._slots + 4);
              *piVar1 = *piVar1 + 0x100;
              bVar36 = 1;
              goto LAB_0012eef1;
            }
LAB_0013013f:
            self = pXVar51;
            X86CallAlloc::run();
            goto LAB_00130144;
          }
          if (uVar44 != 0x100) goto LAB_0013008d;
          if (*(char *)((long)&(pXVar51->super_RAPass)._heap._zone + 4) != '\x01')
          goto LAB_00130092;
          X86RAPass::emitMove(pXVar53,(VirtReg *)pXVar51,(uint)bVar22,uVar35,"Move");
          if (((ulong)(pXVar51->super_RAPass).super_CBPass._vptr_CBPass & 0xf0000000000) !=
              0x10000000000) goto LAB_00130097;
          if (0x1f < bVar22) goto LAB_0013009c;
          if (0x1f < bVar21) goto LAB_001300a1;
          uVar44 = 1 << (bVar22 & 0x1f);
          uVar35 = uVar44 ^ 1 << (uVar35 & 0x1f);
          *(byte *)((long)&(pXVar51->super_RAPass)._heap._zone + 5) = bVar22;
          *(undefined8 *)((long)&(pXVar53->_x86State).field_0 + (long)pXVar47 * 8 + 0xc0) = 0;
          *(X86RAPass **)((long)&(pXVar53->_x86State).field_0 + (long)pXVar32 * 8 + 0xc0) = pXVar51;
          puVar9 = &(pXVar53->_x86State)._occupied.field_0.field_0._vec;
          *puVar9 = *puVar9 ^ uVar35;
          if (*(char *)((long)&(pXVar51->super_RAPass)._heap._zone + 6) == '\0') {
            uVar35 = 0;
          }
          puVar9 = &(pXVar53->_x86State)._modified.field_0.field_0._vec;
          *puVar9 = *puVar9 ^ uVar35;
          X86RAPass::_checkState(pXVar53);
          X86RAPass::_checkState(pXVar53);
          puVar26 = (uint *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b4);
          *puVar26 = *puVar26 | uVar44;
          pbVar4 = (byte *)((long)&pRVar7->offset + 2);
          *pbVar4 = *pbVar4 | 0x40;
          if (*(char *)((long)(self->super_RAPass)._heap._slots + 0x21) != -1) goto LAB_0012eed6;
          goto LAB_001300a6;
        }
LAB_0012ef0b:
        pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        pZVar25 = (self->super_RAPass)._zone;
        uVar41 = (uint)*(ushort *)(pp_Var49 + 0x54) &
                 *(uint *)(pp_Var49 + 0x53) & *(uint *)&pZVar25[1]._end;
        if (uVar41 != 0) {
          pp_Var49 = pp_Var49 + 0x2b;
          pcVar54 = "Save";
          while ((uVar41 & 1) == 0) {
LAB_0012efdc:
            pp_Var49 = pp_Var49 + 1;
            bVar28 = uVar41 < 2;
            uVar41 = uVar41 >> 1;
            if (bVar28) {
              pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
              pZVar25 = (self->super_RAPass)._zone;
              goto LAB_0012effb;
            }
          }
          pVVar39 = (VirtReg *)*pp_Var49;
          if (pVVar39 == (VirtReg *)0x0) goto LAB_0012ff3e;
          if (pVVar39->_modified == '\0') goto LAB_0012ff43;
          if ((pVVar39->_tied != (TiedReg *)0x0) && ((pVVar39->_tied->flags & 0x1002) != 0))
          goto LAB_0012efdc;
          if (((pVVar39->_regInfo)._signature & 0xf00) != 0) goto LAB_0012ff9d;
          if (pVVar39->_state != '\x01') goto LAB_0012ffa2;
          bVar36 = pVVar39->_physId;
          if (bVar36 == 0xff) goto LAB_0012ffa7;
          if (bVar36 < 0x20) {
            pXVar53 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            X86RAPass::emitSave(pXVar53,pVVar39,(uint)bVar36,"Save");
            pVVar39->_modified = '\0';
            pXVar3 = &(pXVar53->_x86State)._modified;
            (pXVar3->field_0).field_0._gp =
                 (pXVar3->field_0).field_0._gp &
                 ((ushort)(-2 << (bVar36 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar36 & 0x1f)));
            X86RAPass::_checkState(pXVar53);
            goto LAB_0012efdc;
          }
          goto LAB_0012ffac;
        }
LAB_0012effb:
        uVar41 = (uint)(*(byte *)((long)pp_Var49 + 0x2a2) &
                       *(byte *)((long)&pZVar25[1]._end + 2) & *(byte *)((long)pp_Var49 + 0x29a));
        if (uVar41 != 0) {
          pp_Var49 = pp_Var49 + 0x3b;
          pcVar54 = "Save";
          while ((uVar41 & 1) == 0) {
LAB_0012f0ce:
            pp_Var49 = pp_Var49 + 1;
            bVar28 = uVar41 < 2;
            uVar41 = uVar41 >> 1;
            if (bVar28) {
              pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
              pZVar25 = (self->super_RAPass)._zone;
              goto LAB_0012f0ed;
            }
          }
          pVVar39 = (VirtReg *)*pp_Var49;
          if (pVVar39 == (VirtReg *)0x0) goto LAB_0012ff48;
          if (pVVar39->_modified == '\0') goto LAB_0012ff4d;
          if ((pVVar39->_tied != (TiedReg *)0x0) && ((pVVar39->_tied->flags & 0x1002) != 0))
          goto LAB_0012f0ce;
          if (((pVVar39->_regInfo)._signature & 0xf00) != 0x200) goto LAB_0012ffb1;
          if (pVVar39->_state != '\x01') goto LAB_0012ffb6;
          bVar36 = pVVar39->_physId;
          if (bVar36 == 0xff) goto LAB_0012ffbb;
          if (bVar36 < 0x20) {
            pXVar53 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            X86RAPass::emitSave(pXVar53,pVVar39,(uint)bVar36,"Save");
            pVVar39->_modified = '\0';
            puVar8 = &(pXVar53->_x86State)._modified.field_0.field_0._mm;
            *puVar8 = *puVar8 & ~(byte)(1 << (bVar36 & 0x1f));
            X86RAPass::_checkState(pXVar53);
            goto LAB_0012f0ce;
          }
          goto LAB_0012ffc0;
        }
LAB_0012f0ed:
        uVar41 = *(uint *)((long)pp_Var49 + 0x29c) & *(uint *)((long)&pZVar25[1]._end + 4) &
                 *(uint *)((long)pp_Var49 + 0x2a4);
        if (uVar41 != 0) {
          pp_Var49 = pp_Var49 + 0x43;
          pcVar54 = "Save";
          while ((uVar41 & 1) == 0) {
LAB_0012f1b9:
            pp_Var49 = pp_Var49 + 1;
            bVar28 = uVar41 < 2;
            uVar41 = uVar41 >> 1;
            if (bVar28) goto LAB_0012f1cc;
          }
          pVVar39 = (VirtReg *)*pp_Var49;
          if (pVVar39 == (VirtReg *)0x0) goto LAB_0012ff57;
          if (pVVar39->_modified == '\0') goto LAB_0012ff5c;
          if ((pVVar39->_tied != (TiedReg *)0x0) && ((pVVar39->_tied->flags & 0x1002) != 0))
          goto LAB_0012f1b9;
          if (((pVVar39->_regInfo)._signature & 0xf00) != 0x100) goto LAB_0012ffc5;
          if (pVVar39->_state != '\x01') goto LAB_0012ffca;
          bVar36 = pVVar39->_physId;
          if (bVar36 == 0xff) goto LAB_0012ffcf;
          if (bVar36 < 0x20) {
            pXVar53 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            X86RAPass::emitSave(pXVar53,pVVar39,(uint)bVar36,"Save");
            pVVar39->_modified = '\0';
            puVar9 = &(pXVar53->_x86State)._modified.field_0.field_0._vec;
            *puVar9 = *puVar9 & (-2 << (bVar36 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar36 & 0x1f));
            X86RAPass::_checkState(pXVar53);
            goto LAB_0012f1b9;
          }
          goto LAB_0012ffd4;
        }
LAB_0012f1cc:
        pcVar16 = (self->super_RAPass).super_CBPass._name;
        bVar36 = pcVar16[0x90];
        if ((ulong)bVar36 != 0) {
          pcVar54 = *(char **)(pcVar16 + 0x150);
          uVar33 = 0;
          while (((((Imm *)pcVar54)->super_Operand).super_Operand_.field_0._any.signature & 7) != 3)
          {
LAB_0012f272:
            uVar33 = uVar33 + 1;
            pcVar54 = (char *)((long)pcVar54 + 0x10);
            if (bVar36 == uVar33) goto LAB_0012f282;
          }
          if (uVar33 < 0x20) {
            uVar41 = *(uint *)(pcVar16 + uVar33 * 4 + 0xb0);
            if ((uVar41 >> 0x10 & 1) == 0) {
              pXVar53 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              uVar44 = (pXVar53->_zsp).super_X86Reg.super_Reg.super_Operand.super_Operand_.field_0.
                       _any.signature;
              aStack_88._any.reserved8_4 = (uVar41 & 0xffff) - (uVar44 >> 0x18);
              aStack_88._packed[0] = (UInt64)((ulong)(uVar44 & 0xf8) | 2);
              aStack_88._any.reserved12_4 =
                   (pXVar53->_zsp).super_X86Reg.super_Reg.super_Operand.super_Operand_.field_0._any.
                   id;
              X86RAPass::emitImmToStack
                        (pXVar53,uVar41 >> 0x18,(X86Mem *)&aStack_88._any,(Imm *)pcVar54);
            }
            else {
              X86RAPass::emitImmToReg
                        ((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,uVar41 >> 0x18,
                         uVar41 & 0xff,(Imm *)pcVar54);
            }
            goto LAB_0012f272;
          }
          goto LAB_0012ff52;
        }
LAB_0012f282:
        uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
        uVar33 = (ulong)uVar41;
        if ((uVar41 & 0xff) != 0) {
          pZVar25 = (self->super_RAPass)._heap._zone;
          uVar34 = 0;
          while (((ulong)(&pZVar25->_end)[uVar34 * 3] & 1) == 0) {
LAB_0012f350:
            uVar34 = uVar34 + 1;
            if (uVar34 == (uVar33 & 0xff)) {
              uVar33 = (ulong)*(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
              pcVar54 = (char *)self;
              goto LAB_0012f366;
            }
          }
          ppuVar5 = &pZVar25->_ptr + uVar34 * 3;
          uVar41 = *(uint *)(ppuVar5 + 2);
          if (uVar41 == 0) goto LAB_0012f350;
          pVVar39 = (VirtReg *)*ppuVar5;
          bVar36 = pVVar39->_physId;
          if (bVar36 == 0xff) goto LAB_0012ffd9;
          if (bVar36 < 0x20) {
            uVar41 = uVar41 & (-2 << (bVar36 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar36 & 0x1f));
            uVar50 = (ulong)uVar41;
            if (uVar41 != 0) {
              uVar46 = 0;
              do {
                if ((uVar50 & 1) != 0) {
                  X86RAPass::emitMove((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,
                                      pVVar39,uVar46,(uint)bVar36,"Duplicate");
                  if (0x1f < uVar46) {
                    X86CallAlloc::run();
                    goto LAB_0012fea8;
                  }
                  pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass + 0x56;
                  *(ushort *)pp_Var49 = *(ushort *)pp_Var49 | (ushort)(1 << ((byte)uVar46 & 0x1f));
                }
                uVar46 = uVar46 + 1;
                uVar41 = (uint)uVar50;
                uVar50 = uVar50 >> 1;
              } while (1 < uVar41);
            }
            goto LAB_0012f350;
          }
          goto LAB_0012ffde;
        }
LAB_0012f366:
        uVar41 = (uint)uVar33;
        if ((uVar33 & 0xff0000) != 0) {
          pTVar14 = (TiedReg *)(self->super_RAPass)._heap._slots[1];
          uVar34 = 0;
          while ((pTVar14[uVar34].flags & 1) == 0) {
LAB_0012f42f:
            uVar34 = uVar34 + 1;
            if (uVar34 == ((uint)(uVar33 >> 0x10) & 0xff)) {
              uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
              pcVar54 = (char *)self;
              goto LAB_0012f445;
            }
          }
          pTVar6 = pTVar14 + uVar34;
          uVar41 = pTVar6->inRegs;
          if (uVar41 == 0) goto LAB_0012f42f;
          pVVar39 = pTVar6->vreg;
          bVar36 = pVVar39->_physId;
          if (bVar36 == 0xff) goto LAB_0012ffe3;
          if (bVar36 < 0x20) {
            uVar41 = uVar41 & (-2 << (bVar36 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar36 & 0x1f));
            if (uVar41 != 0) {
              uVar46 = 0;
              do {
                if ((uVar41 & 1) != 0) {
                  X86RAPass::emitMove((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,
                                      pVVar39,uVar46,(uint)bVar36,"Duplicate");
                  if (0x1f < uVar46) goto LAB_0012fea8;
                  pbVar4 = (byte *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b2);
                  *pbVar4 = *pbVar4 | (byte)(1 << ((byte)uVar46 & 0x1f));
                }
                uVar46 = uVar46 + 1;
                bVar28 = 1 < uVar41;
                uVar41 = uVar41 >> 1;
              } while (bVar28);
            }
            goto LAB_0012f42f;
          }
          goto LAB_0012ffe8;
        }
LAB_0012f445:
        uVar41 = uVar41 >> 8 & 0xff;
        if (uVar41 != 0) {
          pRVar15 = (RACell *)(self->super_RAPass)._heap._slots[0];
          uVar33 = 0;
          while ((pRVar15[uVar33].offset & 1) == 0) {
LAB_0012f510:
            uVar33 = uVar33 + 1;
            pcVar54 = (char *)self;
            if (uVar33 == uVar41) goto LAB_0012f51e;
          }
          pRVar7 = pRVar15 + uVar33;
          uVar44 = pRVar7->alignment;
          if (uVar44 == 0) goto LAB_0012f510;
          pVVar39 = (VirtReg *)pRVar7->next;
          bVar36 = pVVar39->_physId;
          if (bVar36 == 0xff) goto LAB_0012ffed;
          if (bVar36 < 0x20) {
            uVar44 = uVar44 & (-2 << (bVar36 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar36 & 0x1f));
            if (uVar44 != 0) {
              uVar46 = 0;
              do {
                if ((uVar44 & 1) != 0) {
                  X86RAPass::emitMove((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,
                                      pVVar39,uVar46,(uint)bVar36,"Duplicate");
                  if (0x1f < uVar46) goto LAB_0012fead;
                  puVar26 = (uint *)((long)(self->super_RAPass).super_CBPass._vptr_CBPass + 0x2b4);
                  *puVar26 = *puVar26 | 1 << ((byte)uVar46 & 0x1f);
                }
                uVar46 = uVar46 + 1;
                bVar28 = 1 < uVar44;
                uVar44 = uVar44 >> 1;
              } while (bVar28);
            }
            goto LAB_0012f510;
          }
          goto LAB_0012fff2;
        }
LAB_0012f51e:
        pVVar39 = pVStack_78;
        X86RAPass_translateOperands
                  ((X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass,
                   (Operand_ *)pVStack_78[1]._name,(uint)*(byte *)((long)&pVStack_78->_size + 1));
        pCVar12 = (self->super_RAPass).super_CBPass._cb;
        pCVar12->_cursor = (CBNode *)pVVar39;
        if (((pVVar39[1]._size & 0x1000000) != 0) &&
           (iVar48 = *(int *)((long)&pVVar39[2]._tied + 4), iVar48 != 0)) {
          CodeEmitter::emit(&pCVar12->super_CodeEmitter,0x2c4,
                            (Operand_ *)((self->super_RAPass).super_CBPass._vptr_CBPass + 0x27),
                            iVar48);
        }
        pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
        pZVar25 = (self->super_RAPass)._zone;
        uVar41 = (uint)(*(ushort *)(pp_Var49 + 0x53) & *(ushort *)&pZVar25[1]._end);
        if (uVar41 != 0) {
          pp_Var49 = pp_Var49 + 0x2b;
          while ((uVar41 & 1) == 0) {
LAB_0012f626:
            pp_Var49 = pp_Var49 + 1;
            bVar28 = uVar41 < 2;
            uVar41 = uVar41 >> 1;
            if (bVar28) {
              pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
              pZVar25 = (self->super_RAPass)._zone;
              goto LAB_0012f641;
            }
          }
          p_Var17 = *pp_Var49;
          if (p_Var17 == (_func_int *)0x0) goto LAB_0012ff61;
          if ((p_Var17[0x26] == (_func_int)0x0) ||
             ((*(long *)(p_Var17 + 0x30) != 0 &&
              ((*(ushort *)(*(long *)(p_Var17 + 0x30) + 8) & 0x122a) != 0)))) {
            cVar29 = (code)0x2;
          }
          else {
            cVar29 = (code)0x0;
          }
          if (((byte)p_Var17[5] & 0xf) != 0) goto LAB_0012ff66;
          pcVar54 = (char *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          cVar11 = p_Var17[0x25];
          if ((byte)cVar11 == 0xff) {
            p_Var17[0x24] = cVar29;
LAB_0012f61e:
            X86RAPass::_checkState((X86RAPass *)pcVar54);
            goto LAB_0012f626;
          }
          if ((byte)cVar11 < 0x20) {
            p_Var17[0x24] = cVar29;
            *(undefined2 *)(p_Var17 + 0x25) = 0xff;
            uVar23 = (ushort)(-2 << ((byte)cVar11 & 0x1f)) |
                     (ushort)(0xfffffffe >> 0x20 - ((byte)cVar11 & 0x1f));
            (((X86RAPass *)pcVar54)->_x86State).field_0._list[(uint)(byte)cVar11] = (VirtReg *)0x0;
            pXVar3 = &(((X86RAPass *)pcVar54)->_x86State)._occupied;
            (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp & uVar23;
            pXVar3 = &(((X86RAPass *)pcVar54)->_x86State)._modified;
            (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp & uVar23;
            X86RAPass::_checkState((X86RAPass *)pcVar54);
            goto LAB_0012f61e;
          }
          goto LAB_0012fff7;
        }
LAB_0012f641:
        uVar41 = (uint)(*(byte *)((long)pp_Var49 + 0x29a) & *(byte *)((long)&pZVar25[1]._end + 2));
        if (uVar41 != 0) {
          pp_Var49 = pp_Var49 + 0x3b;
          while ((uVar41 & 1) == 0) {
LAB_0012f705:
            pp_Var49 = pp_Var49 + 1;
            bVar28 = uVar41 < 2;
            uVar41 = uVar41 >> 1;
            if (bVar28) {
              pp_Var49 = (self->super_RAPass).super_CBPass._vptr_CBPass;
              pZVar25 = (self->super_RAPass)._zone;
              goto LAB_0012f720;
            }
          }
          p_Var17 = *pp_Var49;
          if (p_Var17 == (_func_int *)0x0) goto LAB_0012ff6b;
          if ((p_Var17[0x26] == (_func_int)0x0) ||
             ((*(long *)(p_Var17 + 0x30) != 0 &&
              ((*(ushort *)(*(long *)(p_Var17 + 0x30) + 8) & 0x122a) != 0)))) {
            cVar29 = (code)0x2;
          }
          else {
            cVar29 = (code)0x0;
          }
          if ((*(uint *)(p_Var17 + 4) & 0xf00) != 0x200) goto LAB_0012ff70;
          pcVar54 = (char *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          cVar11 = p_Var17[0x25];
          if ((byte)cVar11 == 0xff) {
            p_Var17[0x24] = cVar29;
LAB_0012f6fd:
            X86RAPass::_checkState((X86RAPass *)pcVar54);
            goto LAB_0012f705;
          }
          if ((byte)cVar11 < 0x20) {
            p_Var17[0x24] = cVar29;
            *(undefined2 *)(p_Var17 + 0x25) = 0xff;
            *(undefined8 *)
             ((long)&(((X86RAPass *)pcVar54)->_x86State).field_0 +
             (ulong)(uint)(byte)cVar11 * 8 + 0x80) = 0;
            bVar36 = ~(byte)(1 << ((byte)cVar11 & 0x1f));
            puVar8 = &(((X86RAPass *)pcVar54)->_x86State)._occupied.field_0.field_0._mm;
            *puVar8 = *puVar8 & bVar36;
            puVar8 = &(((X86RAPass *)pcVar54)->_x86State)._modified.field_0.field_0._mm;
            *puVar8 = *puVar8 & bVar36;
            X86RAPass::_checkState((X86RAPass *)pcVar54);
            goto LAB_0012f6fd;
          }
          goto LAB_0012fffc;
        }
LAB_0012f720:
        uVar41 = *(uint *)((long)pp_Var49 + 0x29c) & *(uint *)((long)&pZVar25[1]._end + 4);
        if (uVar41 != 0) {
          pp_Var49 = pp_Var49 + 0x43;
          while ((uVar41 & 1) == 0) {
LAB_0012f7dd:
            pp_Var49 = pp_Var49 + 1;
            bVar28 = uVar41 < 2;
            uVar41 = uVar41 >> 1;
            if (bVar28) goto LAB_0012f7f0;
          }
          p_Var17 = *pp_Var49;
          if (p_Var17 == (_func_int *)0x0) goto LAB_0012ff75;
          if ((p_Var17[0x26] == (_func_int)0x0) ||
             ((*(long *)(p_Var17 + 0x30) != 0 &&
              ((*(ushort *)(*(long *)(p_Var17 + 0x30) + 8) & 0x122a) != 0)))) {
            cVar29 = (code)0x2;
          }
          else {
            cVar29 = (code)0x0;
          }
          if ((*(uint *)(p_Var17 + 4) & 0xf00) != 0x100) goto LAB_0012ff7a;
          pcVar54 = (char *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          cVar11 = p_Var17[0x25];
          if ((byte)cVar11 == 0xff) {
            p_Var17[0x24] = cVar29;
LAB_0012f7d5:
            X86RAPass::_checkState((X86RAPass *)pcVar54);
            goto LAB_0012f7dd;
          }
          if ((byte)cVar11 < 0x20) {
            p_Var17[0x24] = cVar29;
            *(undefined2 *)(p_Var17 + 0x25) = 0xff;
            uVar44 = -2 << ((byte)cVar11 & 0x1f) | 0xfffffffeU >> 0x20 - ((byte)cVar11 & 0x1f);
            *(undefined8 *)
             ((long)&(((X86RAPass *)pcVar54)->_x86State).field_0 +
             (ulong)(uint)(byte)cVar11 * 8 + 0xc0) = 0;
            puVar9 = &(((X86RAPass *)pcVar54)->_x86State)._occupied.field_0.field_0._vec;
            *puVar9 = *puVar9 & uVar44;
            puVar9 = &(((X86RAPass *)pcVar54)->_x86State)._modified.field_0.field_0._vec;
            *puVar9 = *puVar9 & uVar44;
            X86RAPass::_checkState((X86RAPass *)pcVar54);
            goto LAB_0012f7d5;
          }
          goto LAB_00130001;
        }
LAB_0012f7f0:
        pcVar16 = (self->super_RAPass).super_CBPass._name;
        lVar45 = 0;
        pXVar53 = (X86RAPass *)CONCAT71((int7)((ulong)pcVar54 >> 8),1);
        while (((uVar41 = *(uint *)(pcVar16 + lVar45 * 4 + 0xa8), (uVar41 >> 0x10 & 1) == 0 ||
                (puVar26 = (uint *)(pcVar16 + lVar45 * 0x10 + 0x130), (*puVar26 & 7) != 1)) ||
               (uVar44 = puVar26[1], uVar44 < 0x100))) {
LAB_0012fc2e:
          lVar45 = 1;
          cVar52 = (char)pXVar53;
          pXVar53 = (X86RAPass *)0x0;
          if (cVar52 == '\0') {
            uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
            if ((uVar41 & 0xff) != 0) {
              pZVar25 = (self->super_RAPass)._heap._zone;
              lVar45 = 0;
              while ((*(byte *)((long)&pZVar25->_end + lVar45 + 1) & 0x10) == 0) {
LAB_0012fd02:
                lVar45 = lVar45 + 0x18;
                if ((ulong)((uVar41 & 0xff) << 3) * 3 == lVar45) {
                  uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
                  goto LAB_0012fd0f;
                }
              }
              lVar30 = *(long *)((long)&pZVar25->_ptr + lVar45);
              if ((*(byte *)(lVar30 + 5) & 0xf) != 0) goto LAB_0012ff7f;
              pXVar53 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              bVar36 = *(byte *)(lVar30 + 0x25);
              if (bVar36 == 0xff) {
                *(undefined1 *)(lVar30 + 0x24) = 0;
LAB_0012fcfa:
                X86RAPass::_checkState(pXVar53);
                goto LAB_0012fd02;
              }
              if (bVar36 < 0x20) {
                *(undefined2 *)(lVar30 + 0x24) = 0xff00;
                *(undefined1 *)(lVar30 + 0x26) = 0;
                uVar23 = (ushort)(-2 << (bVar36 & 0x1f)) |
                         (ushort)(0xfffffffe >> 0x20 - (bVar36 & 0x1f));
                (pXVar53->_x86State).field_0._list[(uint)bVar36] = (VirtReg *)0x0;
                pXVar3 = &(pXVar53->_x86State)._occupied;
                (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp & uVar23;
                pXVar3 = &(pXVar53->_x86State)._modified;
                (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp & uVar23;
                X86RAPass::_checkState(pXVar53);
                goto LAB_0012fcfa;
              }
              goto LAB_00130010;
            }
LAB_0012fd0f:
            uVar44 = uVar41 >> 0x10 & 0xff;
            if (uVar44 != 0) {
              pTVar14 = (TiedReg *)(self->super_RAPass)._heap._slots[1];
              lVar45 = 0;
              while ((*(byte *)((long)&pTVar14->flags + lVar45 + 1) & 0x10) == 0) {
LAB_0012fdae:
                lVar45 = lVar45 + 0x18;
                if ((ulong)(uVar44 << 3) * 3 == lVar45) {
                  uVar41 = *(uint *)((long)(self->super_RAPass)._heap._slots + 0x1c);
                  goto LAB_0012fdbf;
                }
              }
              lVar30 = *(long *)((long)&pTVar14->vreg + lVar45);
              if ((*(uint *)(lVar30 + 4) & 0xf00) != 0x200) goto LAB_0012ff84;
              pXVar53 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              bVar36 = *(byte *)(lVar30 + 0x25);
              if (bVar36 == 0xff) {
                *(undefined1 *)(lVar30 + 0x24) = 0;
LAB_0012fda6:
                X86RAPass::_checkState(pXVar53);
                goto LAB_0012fdae;
              }
              if (bVar36 < 0x20) {
                *(undefined2 *)(lVar30 + 0x24) = 0xff00;
                *(undefined1 *)(lVar30 + 0x26) = 0;
                *(undefined8 *)
                 ((long)&(pXVar53->_x86State).field_0 + (ulong)(uint)bVar36 * 8 + 0x80) = 0;
                bVar36 = ~(byte)(1 << (bVar36 & 0x1f));
                puVar8 = &(pXVar53->_x86State)._occupied.field_0.field_0._mm;
                *puVar8 = *puVar8 & bVar36;
                puVar8 = &(pXVar53->_x86State)._modified.field_0.field_0._mm;
                *puVar8 = *puVar8 & bVar36;
                X86RAPass::_checkState(pXVar53);
                goto LAB_0012fda6;
              }
              goto LAB_00130015;
            }
LAB_0012fdbf:
            uVar41 = uVar41 >> 8 & 0xff;
            if (uVar41 == 0) goto LAB_0012fe66;
            pRVar15 = (RACell *)(self->super_RAPass)._heap._slots[0];
            lVar45 = 0;
            while ((*(byte *)((long)&pRVar15->offset + lVar45 + 1) & 0x10) == 0) {
LAB_0012fe59:
              lVar45 = lVar45 + 0x18;
              if ((ulong)(uVar41 << 3) * 3 == lVar45) {
LAB_0012fe66:
                uVar33 = (ulong)*(uint *)((self->super_RAPass)._heap._slots + 3);
                if (uVar33 != 0) {
                  lVar45 = 0;
                  do {
                    *(undefined8 *)
                     (*(long *)((long)&((self->super_RAPass)._heap._zone)->_ptr + lVar45) + 0x30) =
                         0;
                    lVar45 = lVar45 + 0x18;
                  } while (uVar33 * 0x18 != lVar45);
                }
                return 0;
              }
            }
            lVar30 = *(long *)((long)&pRVar15->next + lVar45);
            if ((*(uint *)(lVar30 + 4) & 0xf00) != 0x100) goto LAB_0012ff89;
            pXVar53 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            bVar36 = *(byte *)(lVar30 + 0x25);
            if (bVar36 == 0xff) {
              *(undefined1 *)(lVar30 + 0x24) = 0;
LAB_0012fe51:
              X86RAPass::_checkState(pXVar53);
              goto LAB_0012fe59;
            }
            if (bVar36 < 0x20) {
              *(undefined2 *)(lVar30 + 0x24) = 0xff00;
              *(undefined1 *)(lVar30 + 0x26) = 0;
              uVar44 = -2 << (bVar36 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar36 & 0x1f);
              *(undefined8 *)((long)&(pXVar53->_x86State).field_0 + (ulong)(uint)bVar36 * 8 + 0xc0)
                   = 0;
              puVar9 = &(pXVar53->_x86State)._occupied.field_0.field_0._vec;
              *puVar9 = *puVar9 & uVar44;
              puVar9 = &(pXVar53->_x86State)._modified.field_0.field_0._vec;
              *puVar9 = *puVar9 & uVar44;
              X86RAPass::_checkState(pXVar53);
              goto LAB_0012fe51;
            }
            goto LAB_0013001f;
          }
        }
        if (uVar44 == 0xffffffff) goto LAB_00130033;
        pCVar12 = (self->super_RAPass).super_CBPass._cb;
        uVar18._0_4_ = pCVar12[1].super_CodeEmitter._privateData;
        uVar18._4_4_ = pCVar12[1].super_CodeEmitter._globalHints;
        if (uVar18 <= uVar44 - 0x100) goto LAB_00130038;
        pVVar39 = *(VirtReg **)
                   (*(long *)&pCVar12[1].super_CodeEmitter._type + (ulong)(uVar44 - 0x100) * 8);
        uVar35 = uVar41 & 0xff;
        pXVar47 = (X86RAPass *)(ulong)uVar35;
        uVar44 = (pVVar39->_regInfo)._signature >> 8 & 0xf;
        bVar36 = (byte)uVar41;
        if (uVar44 != 2) {
          if (uVar44 == 1) {
            uVar41 = uVar41 >> 8 & 0xff;
            if (uVar41 < 0x20) {
              if ((*(uint *)(x86OpData + (ulong)uVar41 * 4) & 0xf00) == 0x100) {
                pXVar51 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
                bVar21 = pVVar39->_physId;
                if (bVar21 == 0xff) {
                  pVVar39->_state = '\0';
LAB_0012fbb3:
                  X86RAPass::_checkState(pXVar51);
                  if (((pVVar39->_regInfo)._signature & 0xf00) != 0x100) goto LAB_00130167;
                  if (uVar35 == 0xff) goto LAB_00130171;
                  if (uVar35 < 0x20) {
                    uVar41 = 1 << (bVar36 & 0x1f);
                    pXVar32 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
                    pVVar39->_state = '\x01';
                    pVVar39->_modified = '\x01';
                    pVVar39->_physId = bVar36;
                    pVVar39->_homeMask = pVVar39->_homeMask | uVar41;
                    *(VirtReg **)((long)&(pXVar32->_x86State).field_0 + (long)pXVar47 * 8 + 0xc0) =
                         pVVar39;
                    puVar9 = &(pXVar32->_x86State)._occupied.field_0.field_0._vec;
                    *puVar9 = *puVar9 | uVar41;
                    puVar9 = &(pXVar32->_x86State)._modified.field_0.field_0._vec;
                    *puVar9 = *puVar9 | uVar41;
                    goto LAB_0012fc24;
                  }
                  goto LAB_00130176;
                }
                if (bVar21 < 0x20) {
                  pVVar39->_state = '\0';
                  pVVar39->_physId = 0xff;
                  pVVar39->_modified = '\0';
                  uVar41 = -2 << (bVar21 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar21 & 0x1f);
                  *(undefined8 *)
                   ((long)&(pXVar51->_x86State).field_0 + (ulong)(uint)bVar21 * 8 + 0xc0) = 0;
                  puVar9 = &(pXVar51->_x86State)._occupied.field_0.field_0._vec;
                  *puVar9 = *puVar9 & uVar41;
                  puVar9 = &(pXVar51->_x86State)._modified.field_0.field_0._vec;
                  *puVar9 = *puVar9 & uVar41;
                  X86RAPass::_checkState(pXVar51);
                  goto LAB_0012fbb3;
                }
                goto LAB_0013017b;
              }
              pXVar51 = self;
              if ((long)(char)pVVar39->_typeId < 0) goto LAB_00130162;
              cVar52 = TypeId::_info[(long)(char)pVVar39->_typeId + 0x80];
              pXVar51 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              pXVar47 = pXVar51;
              if (pVVar39->_memCell == (RACell *)0x0) {
                RAPass::_newVarCell((RAPass *)pXVar51,pVVar39);
                pXVar47 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
              }
              aStack_88._any.reserved12_4 = pVVar39->_id;
              aStack_88._any.reserved8_4 = 0;
              aStack_88._any.id = 0xffffffff;
              aStack_88._any.signature =
                   (((pXVar51->super_RAPass).super_CBPass._cb)->super_CodeEmitter)._nativeGpReg.
                   super_Operand.super_Operand_.field_0._any.signature & 0xf8 | 0x8002 |
                   (uint)(cVar52 != '*') * 0x4000000 + 0x4000000;
              if (((pVVar39->_regInfo)._signature & 0xf00) != 0x100) goto LAB_0013016c;
              bVar36 = pVVar39->_physId;
              if (bVar36 == 0xff) {
                pVVar39->_state = '\x02';
LAB_0012fc4f:
                X86RAPass::_checkState(pXVar47);
                CodeEmitter::emit(&((self->super_RAPass).super_CBPass._cb)->super_CodeEmitter,0xe7,
                                  (Operand_ *)&aStack_88._any);
                goto LAB_0012fc2e;
              }
              if (bVar36 < 0x20) {
                pVVar39->_state = '\x02';
                pVVar39->_physId = 0xff;
                pVVar39->_modified = '\0';
                uVar41 = -2 << (bVar36 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar36 & 0x1f);
                *(undefined8 *)
                 ((long)&(pXVar47->_x86State).field_0 + (ulong)(uint)bVar36 * 8 + 0xc0) = 0;
                puVar9 = &(pXVar47->_x86State)._occupied.field_0.field_0._vec;
                *puVar9 = *puVar9 & uVar41;
                puVar9 = &(pXVar47->_x86State)._modified.field_0.field_0._vec;
                *puVar9 = *puVar9 & uVar41;
                X86RAPass::_checkState(pXVar47);
                goto LAB_0012fc4f;
              }
              goto LAB_00130180;
            }
            goto LAB_001300ce;
          }
          if (uVar44 != 0) goto LAB_0012fc2e;
          pXVar51 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          bVar21 = pVVar39->_physId;
          if (bVar21 != 0xff) {
            if (bVar21 < 0x20) {
              pVVar39->_state = '\0';
              pVVar39->_physId = 0xff;
              pVVar39->_modified = '\0';
              uVar23 = (ushort)(-2 << (bVar21 & 0x1f)) |
                       (ushort)(0xfffffffe >> 0x20 - (bVar21 & 0x1f));
              (pXVar51->_x86State).field_0._list[(uint)bVar21] = (VirtReg *)0x0;
              pXVar3 = &(pXVar51->_x86State)._occupied;
              (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp & uVar23;
              pXVar3 = &(pXVar51->_x86State)._modified;
              (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp & uVar23;
              X86RAPass::_checkState(pXVar51);
              goto LAB_0012fb3f;
            }
            goto LAB_0013015d;
          }
          pVVar39->_state = '\0';
LAB_0012fb3f:
          X86RAPass::_checkState(pXVar51);
          if (((pVVar39->_regInfo)._signature & 0xf00) == 0) {
            if (bVar36 == 0xff) goto LAB_001300e2;
            if ((uVar41 & 0xff) == 4) goto LAB_001300ff;
            if (0x1f < uVar35) {
              X86CallAlloc::run();
              goto LAB_0013011c;
            }
            uVar41 = 1 << (bVar36 & 0x1f);
            pXVar32 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
            pVVar39->_state = '\x01';
            pVVar39->_modified = '\x01';
            pVVar39->_physId = bVar36;
            pVVar39->_homeMask = pVVar39->_homeMask | uVar41;
            (pXVar32->_x86State).field_0._list[(long)pXVar47] = pVVar39;
            pXVar3 = &(pXVar32->_x86State)._occupied;
            uVar23 = (ushort)uVar41;
            (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp | uVar23;
            pXVar3 = &(pXVar32->_x86State)._modified;
            (pXVar3->field_0).field_0._gp = (pXVar3->field_0).field_0._gp | uVar23;
            goto LAB_0012fc24;
          }
          goto LAB_001300d3;
        }
        pXVar51 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
        bVar21 = pVVar39->_physId;
        if (bVar21 != 0xff) {
          if (bVar21 < 0x20) {
            pVVar39->_state = '\0';
            pVVar39->_physId = 0xff;
            pVVar39->_modified = '\0';
            *(undefined8 *)((long)&(pXVar51->_x86State).field_0 + (ulong)(uint)bVar21 * 8 + 0x80) =
                 0;
            bVar21 = ~(byte)(1 << (bVar21 & 0x1f));
            puVar8 = &(pXVar51->_x86State)._occupied.field_0.field_0._mm;
            *puVar8 = *puVar8 & bVar21;
            puVar8 = &(pXVar51->_x86State)._modified.field_0.field_0._mm;
            *puVar8 = *puVar8 & bVar21;
            X86RAPass::_checkState(pXVar51);
            goto LAB_0012fac4;
          }
          goto LAB_00130158;
        }
        pVVar39->_state = '\0';
LAB_0012fac4:
        X86RAPass::_checkState(pXVar51);
        if (((pVVar39->_regInfo)._signature & 0xf00) != 0x200) goto LAB_001300d8;
        if (uVar35 != 0xff) {
          if (0x1f < uVar35) {
            X86CallAlloc::run();
LAB_001300ff:
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/x86regalloc_p.h"
                       ,0x164,"C != X86Reg::kKindGp || physId != X86Gp::kIdSp");
          }
          uVar41 = 1 << (bVar36 & 0x1f);
          pXVar32 = (X86RAPass *)(self->super_RAPass).super_CBPass._vptr_CBPass;
          pVVar39->_state = '\x01';
          pVVar39->_modified = '\x01';
          pVVar39->_physId = bVar36;
          pVVar39->_homeMask = pVVar39->_homeMask | uVar41;
          *(VirtReg **)((long)&(pXVar32->_x86State).field_0 + (long)pXVar47 * 8 + 0x80) = pVVar39;
          puVar8 = &(pXVar32->_x86State)._occupied.field_0.field_0._mm;
          bVar36 = (byte)uVar41;
          *puVar8 = *puVar8 | bVar36;
          puVar8 = &(pXVar32->_x86State)._modified.field_0.field_0._mm;
          *puVar8 = *puVar8 | bVar36;
LAB_0012fc24:
          X86RAPass::_checkState(pXVar32);
          goto LAB_0012fc2e;
        }
        goto LAB_001300dd;
      }
      if ((uVar41 & 7) == 1) {
        uVar41 = *(uint *)((undefined1 *)((long)&opArray->field_0 + 4) + lVar45);
        in_RAX = (uint *)(ulong)uVar41;
        if (0xff < uVar41) {
          if (uVar41 == 0xffffffff) {
            pcStack_40 = (code *)0x12dca4;
            X86RAPass_translateOperands();
LAB_0012dca4:
            pcStack_40 = (code *)0x12dca9;
            X86RAPass_translateOperands();
LAB_0012dca9:
            pcStack_40 = (code *)0x12dcae;
            X86RAPass_translateOperands();
LAB_0012dcae:
            pcStack_40 = (code *)0x12dcb3;
            X86RAPass_translateOperands();
LAB_0012dcb3:
            pcStack_40 = (code *)0x12dcb8;
            X86RAPass_translateOperands();
LAB_0012dcb8:
            pcStack_40 = (code *)0x12dcbd;
            X86RAPass_translateOperands();
            goto LAB_0012dcbd;
          }
          uVar50._0_4_ = pCVar12[1].super_CodeEmitter._privateData;
          uVar50._4_4_ = pCVar12[1].super_CodeEmitter._globalHints;
          if (uVar50 <= uVar41 - 0x100) goto LAB_0012dca4;
          lVar30 = *(long *)(*(long *)&pCVar12[1].super_CodeEmitter._type +
                            (ulong)(uVar41 - 0x100) * 8);
          if (lVar30 == 0) goto LAB_0012dca9;
          bVar36 = *(byte *)(lVar30 + 0x25);
          if (bVar36 == 0xff) goto LAB_0012dcae;
          in_RAX = &opArray[(long)pXVar53].field_0._signature + 1;
LAB_0012dc7b:
          *in_RAX = (uint)bVar36;
        }
      }
LAB_0012dc80:
      pXVar53 = (X86RAPass *)((long)&(pXVar53->super_RAPass).super_CBPass._vptr_CBPass + 1);
      lVar45 = lVar45 + 0x10;
    } while (pXVar47 != (X86RAPass *)lVar45);
  }
  return (Error)in_RAX;
LAB_0012fea8:
  X86CallAlloc::run();
LAB_0012fead:
  X86CallAlloc::run();
LAB_0012feb2:
  X86CallAlloc::run();
LAB_0012feb7:
  X86CallAlloc::run();
LAB_0012febc:
  X86CallAlloc::run();
LAB_0012fec1:
  X86CallAlloc::run();
LAB_0012fec6:
  X86CallAlloc::run();
LAB_0012fecb:
  X86CallAlloc::run();
LAB_0012fed0:
  X86CallAlloc::run();
LAB_0012fed5:
  X86CallAlloc::run();
LAB_0012feda:
  X86CallAlloc::run();
LAB_0012fedf:
  X86CallAlloc::run();
LAB_0012fee4:
  X86CallAlloc::run();
LAB_0012fee9:
  X86CallAlloc::run();
LAB_0012feee:
  X86CallAlloc::run();
LAB_0012fef3:
  X86CallAlloc::run();
LAB_0012fef8:
  X86CallAlloc::run();
LAB_0012fefd:
  X86CallAlloc::run();
LAB_0012ff02:
  X86CallAlloc::run();
LAB_0012ff07:
  X86CallAlloc::run();
LAB_0012ff0c:
  X86CallAlloc::run();
LAB_0012ff11:
  X86CallAlloc::run();
LAB_0012ff16:
  X86CallAlloc::run();
LAB_0012ff1b:
  X86CallAlloc::run();
LAB_0012ff20:
  X86CallAlloc::run();
LAB_0012ff25:
  X86CallAlloc::run();
LAB_0012ff2a:
  X86CallAlloc::run();
LAB_0012ff2f:
  X86CallAlloc::run();
LAB_0012ff34:
  X86CallAlloc::run();
LAB_0012ff39:
  X86CallAlloc::run();
LAB_0012ff3e:
  X86CallAlloc::run();
LAB_0012ff43:
  X86CallAlloc::run();
LAB_0012ff48:
  X86CallAlloc::run();
LAB_0012ff4d:
  X86CallAlloc::run();
LAB_0012ff52:
  X86CallAlloc::run();
LAB_0012ff57:
  X86CallAlloc::run();
LAB_0012ff5c:
  X86CallAlloc::run();
LAB_0012ff61:
  X86CallAlloc::run();
LAB_0012ff66:
  X86CallAlloc::run();
LAB_0012ff6b:
  X86CallAlloc::run();
LAB_0012ff70:
  X86CallAlloc::run();
LAB_0012ff75:
  X86CallAlloc::run();
LAB_0012ff7a:
  X86CallAlloc::run();
LAB_0012ff7f:
  X86CallAlloc::run();
LAB_0012ff84:
  X86CallAlloc::run();
LAB_0012ff89:
  X86CallAlloc::run();
LAB_0012ff8e:
  X86CallAlloc::run();
LAB_0012ff93:
  X86CallAlloc::run();
LAB_0012ff98:
  X86CallAlloc::run();
LAB_0012ff9d:
  X86CallAlloc::run();
LAB_0012ffa2:
  X86CallAlloc::run();
LAB_0012ffa7:
  X86CallAlloc::run();
LAB_0012ffac:
  X86CallAlloc::run();
LAB_0012ffb1:
  X86CallAlloc::run();
LAB_0012ffb6:
  X86CallAlloc::run();
LAB_0012ffbb:
  X86CallAlloc::run();
LAB_0012ffc0:
  X86CallAlloc::run();
LAB_0012ffc5:
  X86CallAlloc::run();
LAB_0012ffca:
  X86CallAlloc::run();
LAB_0012ffcf:
  X86CallAlloc::run();
LAB_0012ffd4:
  X86CallAlloc::run();
LAB_0012ffd9:
  X86CallAlloc::run();
LAB_0012ffde:
  X86CallAlloc::run();
LAB_0012ffe3:
  X86CallAlloc::run();
LAB_0012ffe8:
  X86CallAlloc::run();
LAB_0012ffed:
  X86CallAlloc::run();
LAB_0012fff2:
  X86CallAlloc::run();
LAB_0012fff7:
  X86CallAlloc::run();
LAB_0012fffc:
  X86CallAlloc::run();
LAB_00130001:
  X86CallAlloc::run();
LAB_00130006:
  X86CallAlloc::run();
LAB_0013000b:
  X86CallAlloc::run();
LAB_00130010:
  X86CallAlloc::run();
LAB_00130015:
  X86CallAlloc::run();
LAB_0013001a:
  X86CallAlloc::run();
LAB_0013001f:
  X86CallAlloc::run();
LAB_00130024:
  X86CallAlloc::run();
LAB_00130029:
  X86CallAlloc::run();
LAB_0013002e:
  X86CallAlloc::run();
LAB_00130033:
  X86CallAlloc::run();
LAB_00130038:
  X86CallAlloc::run();
LAB_0013003d:
  X86CallAlloc::run();
LAB_00130042:
  X86CallAlloc::run();
LAB_00130047:
  X86CallAlloc::run();
LAB_0013004c:
  X86CallAlloc::run();
LAB_00130051:
  X86CallAlloc::run();
LAB_00130056:
  X86CallAlloc::run();
LAB_0013005b:
  X86CallAlloc::run();
LAB_00130060:
  X86CallAlloc::run();
LAB_00130065:
  X86CallAlloc::run();
LAB_0013006a:
  X86CallAlloc::run();
LAB_0013006f:
  X86CallAlloc::run();
LAB_00130074:
  X86CallAlloc::run();
LAB_00130079:
  X86CallAlloc::run();
LAB_0013007e:
  X86CallAlloc::run();
LAB_00130083:
  X86CallAlloc::run();
LAB_00130088:
  X86CallAlloc::run();
LAB_0013008d:
  X86CallAlloc::run();
LAB_00130092:
  X86CallAlloc::run();
LAB_00130097:
  X86CallAlloc::run();
LAB_0013009c:
  X86CallAlloc::run();
LAB_001300a1:
  X86CallAlloc::run();
LAB_001300a6:
  X86CallAlloc::run();
LAB_001300ab:
  X86CallAlloc::run();
LAB_001300b0:
  X86CallAlloc::run();
LAB_001300b5:
  X86CallAlloc::run();
LAB_001300ba:
  X86CallAlloc::run();
LAB_001300bf:
  X86CallAlloc::run();
LAB_001300c4:
  X86CallAlloc::run();
LAB_001300c9:
  X86CallAlloc::run();
LAB_001300ce:
  X86CallAlloc::run();
LAB_001300d3:
  X86CallAlloc::run();
LAB_001300d8:
  X86CallAlloc::run();
LAB_001300dd:
  X86CallAlloc::run();
LAB_001300e2:
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/x86regalloc_p.h"
             ,0x161,"physId != Globals::kInvalidRegId");
}

Assistant:

static Error X86RAPass_translateOperands(X86RAPass* self, Operand_* opArray, uint32_t opCount) {
  X86Compiler* cc = self->cc();

  // Translate variables into registers.
  for (uint32_t i = 0; i < opCount; i++) {
    Operand_* op = &opArray[i];
    if (op->isVirtReg()) {
      VirtReg* vreg = cc->getVirtRegById(op->getId());
      ASMJIT_ASSERT(vreg != nullptr);
      ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
      op->_reg.id = vreg->getPhysId();
    }
    else if (op->isMem()) {
      X86Mem* m = static_cast<X86Mem*>(op);

      if (m->hasBaseReg() && cc->isVirtRegValid(m->getBaseId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getBaseId());

        if (m->isRegHome()) {
          self->getVarCell(vreg);
        }
        else {
          ASMJIT_ASSERT(vreg->getPhysId() != Globals::kInvalidRegId);
          op->_mem.base = vreg->getPhysId();
        }
      }

      if (m->hasIndexReg() && cc->isVirtRegValid(m->getIndexId())) {
        VirtReg* vreg = cc->getVirtRegById(m->getIndexId());
        op->_mem.index = vreg->getPhysId();
      }
    }
  }

  return kErrorOk;
}